

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_save_file(uchar *buffer,size_t buffersize,char *filename)

{
  FILE *__s;
  FILE *file;
  char *filename_local;
  size_t buffersize_local;
  uchar *buffer_local;
  
  __s = fopen(filename,"wb");
  if (__s == (FILE *)0x0) {
    buffer_local._4_4_ = 0x4f;
  }
  else {
    fwrite(buffer,1,buffersize,__s);
    fclose(__s);
    buffer_local._4_4_ = 0;
  }
  return buffer_local._4_4_;
}

Assistant:

unsigned lodepng_save_file(const unsigned char* buffer, size_t buffersize, const char* filename)
{
  FILE* file;
  file = fopen(filename, "wb" );
  if(!file) return 79;
  fwrite((char*)buffer , 1 , buffersize, file);
  fclose(file);
  return 0;
}